

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

cmValue __thiscall
cmTargetInternals::GetFileSetDirectories
          (cmTargetInternals *this,cmTarget *self,string *fileSetName,string_view fileSetType)

{
  cmMakefile *this_00;
  basic_string_view<char,_std::char_traits<char>_> __y;
  bool bVar1;
  int iVar2;
  string *this_01;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *r;
  string local_b0;
  string local_80;
  cmTargetInternals *local_60;
  size_t local_58;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_50;
  cmFileSet *local_40;
  cmFileSet *fileSet;
  string *fileSetName_local;
  cmTarget *self_local;
  cmTargetInternals *this_local;
  string_view fileSetType_local;
  
  fileSetType_local._M_len = (size_t)fileSetType._M_str;
  this_local = (cmTargetInternals *)fileSetType._M_len;
  fileSet = (cmFileSet *)fileSetName;
  fileSetName_local = (string *)self;
  self_local = (cmTarget *)this;
  local_40 = cmTarget::GetFileSet(self,fileSetName);
  if (local_40 == (cmFileSet *)0x0) {
    cmValue::cmValue((cmValue *)&fileSetType_local._M_str,(nullptr_t)0x0);
  }
  else {
    this_01 = cmFileSet::GetType_abi_cxx11_(local_40);
    local_50 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_01);
    local_60 = this_local;
    local_58 = fileSetType_local._M_len;
    __y._M_str = (char *)fileSetType_local._M_len;
    __y._M_len = (size_t)this_local;
    bVar1 = std::operator!=(local_50,__y);
    if (bVar1) {
      this_00 = this->Makefile;
      cmStrCat<char_const(&)[11],std::__cxx11::string_const&,char_const(&)[19],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[3]>
                (&local_80,(char (*) [11])"File set \"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)fileSet,
                 (char (*) [19])"\" is not of type \"",
                 (basic_string_view<char,_std::char_traits<char>_> *)&this_local,
                 (char (*) [3])0x111e91e);
      cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      cmValue::cmValue((cmValue *)&fileSetType_local._M_str,(nullptr_t)0x0);
    }
    else {
      if (GetFileSetDirectories(cmTarget_const*,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)
          ::output_abi_cxx11_ == '\0') {
        iVar2 = __cxa_guard_acquire(&GetFileSetDirectories(cmTarget_const*,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)
                                     ::output_abi_cxx11_);
        if (iVar2 != 0) {
          std::__cxx11::string::string
                    ((string *)
                     &GetFileSetDirectories(cmTarget_const*,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)
                      ::output_abi_cxx11_);
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetFileSetDirectories(cmTarget_const*,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)
                        ::output_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&GetFileSetDirectories(cmTarget_const*,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)
                               ::output_abi_cxx11_);
        }
      }
      r = cmFileSet::GetDirectoryEntries_abi_cxx11_(local_40);
      cmList::
      to_string<std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_0>
                (&local_b0,r);
      std::__cxx11::string::operator=
                ((string *)
                 &GetFileSetDirectories(cmTarget_const*,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)
                  ::output_abi_cxx11_,(string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      cmValue::cmValue((cmValue *)&fileSetType_local._M_str,
                       &GetFileSetDirectories(cmTarget_const*,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)
                        ::output_abi_cxx11_);
    }
  }
  return (cmValue)(string *)fileSetType_local._M_str;
}

Assistant:

cmValue cmTargetInternals::GetFileSetDirectories(
  cmTarget const* self, std::string const& fileSetName,
  cm::string_view fileSetType) const
{
  auto const* fileSet = self->GetFileSet(fileSetName);
  if (!fileSet) {
    return nullptr;
  }
  if (fileSet->GetType() != fileSetType) {
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                 cmStrCat("File set \"", fileSetName,
                                          "\" is not of type \"", fileSetType,
                                          "\"."));
    return nullptr;
  }
  static std::string output;
  output = cmList::to_string(fileSet->GetDirectoryEntries());
  return cmValue(output);
}